

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  ulong uVar1;
  LogMessage *other;
  ulong uVar2;
  ulong uVar3;
  string *psVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  psVar4 = this->target_;
  if (psVar4 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x8e);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    psVar4 = this->target_;
  }
  uVar1 = psVar4->_M_string_length;
  uVar2 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(psVar4->_M_dataplus)._M_p != &psVar4->field_2) {
    uVar2 = (psVar4->field_2)._M_allocated_capacity;
  }
  uVar3 = uVar1 * 2;
  if (uVar1 < uVar2) {
    uVar3 = uVar2;
  }
  if (uVar1 + 0x7fffffff < uVar3) {
    uVar3 = uVar1 + 0x7fffffff;
  }
  uVar2 = 0x10;
  if (0x10 < uVar3) {
    uVar2 = uVar3;
  }
  std::__cxx11::string::resize((ulong)psVar4,(char)uVar2);
  *data = (this->target_->_M_dataplus)._M_p + uVar1;
  *size = (int)this->target_->_M_string_length - (int)uVar1;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}